

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<1,451>::print<std::back_insert_iterator<std::__cxx11::string>>
          (Type<1,451> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  DirectoryRecord *pDVar2;
  TextRecord *entry_1;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  DirectoryRecord *this_00;
  int local_78;
  int local_74;
  StructureDivision local_70;
  
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = (double)*(int *)this;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = *(double *)(this + 8);
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)*(int *)(this + 0x10);
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)*(int *)(this + 0x14);
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)*(int *)(this + 0x18);
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)(long)*(int *)(this + 0x1c);
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)&local_70,it,MAT,MF,0x1c3);
  lVar3 = 0x20;
  do {
    ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
              ((ControlRecord *)(this + lVar3),it,MAT,MF,0x1c3);
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0xb0);
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0xb8);
  for (value = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0xb0);
      value != pbVar1; value = value + 1) {
    local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
    super__Head_base<5UL,_long,_false>._M_head_impl._0_4_ = MAT;
    local_78 = 0x1c3;
    local_74 = MF;
    tools::disco::Character<66u>::
    write<std::__cxx11::string,std::back_insert_iterator<std::__cxx11::string>>(value,it);
    tools::disco::
    Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
    ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
              (it,(int *)&local_70,&local_74,&local_78);
  }
  pDVar2 = *(DirectoryRecord **)(this + 0xd0);
  for (this_00 = *(DirectoryRecord **)(this + 200); this_00 != pDVar2; this_00 = this_00 + 1) {
    DirectoryRecord::print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,0x1c3)
    ;
  }
  sectionEndRecord(&local_70,MAT,MF);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_70,it);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF ) const {

  int MT = 451;
  ControlRecord( this->ZA(), this->AWR(), this->LRP(),this->LFI(),
                 this->NLIB(), this->NMOD() ).print( it, MAT, MF, MT );
  for ( const auto& entry : this->parameters_ ) entry.print( it, MAT, MF, MT );
  for ( const auto& entry : this->description_ ) entry.print( it, MAT, MF, MT );
  for ( const auto& entry : this->index_ ) entry.print( it, MAT, MF, MT );
  SEND( MAT, MF ).print( it );
}